

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

void __thiscall gjkepa2_impl::GJK::getsupport(GJK *this,btVector3 *d,sSV *sv)

{
  btVector3 bVar1;
  btScalar local_1c;
  
  local_1c = btVector3::length(d);
  bVar1 = operator/(d,&local_1c);
  *&(sv->d).m_floats = bVar1.m_floats;
  bVar1 = MinkowskiDiff::Support(&this->m_shape,&sv->d);
  *&(sv->w).m_floats = bVar1.m_floats;
  return;
}

Assistant:

void				getsupport(const btVector3& d,sSV& sv) const
			{
				sv.d	=	d/d.length();
				sv.w	=	m_shape.Support(sv.d);
			}